

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::Vertex::getNeighborhood
          (Vertex *this,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  _List_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  HalfedgeIter h;
  double dist;
  _List_iterator<CMU462::Halfedge> local_38;
  double local_30;
  double local_28;
  
  if (depth < 0) {
    return;
  }
  local_38._M_node = (this->_halfedge)._M_node;
  local_30 = INFINITY;
  p_Var6 = &(seen->_M_t)._M_impl.super__Rb_tree_header._M_header;
  do {
    p_Var1 = local_38._M_node[1]._M_prev[2]._M_prev;
    p_Var5 = (seen->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = p_Var6;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        bVar7 = *(_List_node_base **)(p_Var5 + 1) < p_Var1[0xf]._M_prev;
        if (!bVar7) {
          p_Var2 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[bVar7];
      } while (p_Var5 != (_Base_ptr)0x0);
    }
    p_Var3 = (_Rb_tree_header *)p_Var6;
    if ((p_Var2 != p_Var6) &&
       (p_Var3 = (_Rb_tree_header *)p_Var2,
       p_Var1[0xf]._M_prev < (_List_node_base *)((_Rb_tree_header *)p_Var2)->_M_node_count)) {
      p_Var3 = (_Rb_tree_header *)p_Var6;
    }
    if (p_Var3 != (_Rb_tree_header *)p_Var6) {
      dVar9 = (double)p_Var1[1]._M_prev - (this->position).x;
      dVar10 = (double)p_Var1[2]._M_next - (this->position).y;
      dVar8 = (double)p_Var1[2]._M_prev - (this->position).z;
      dVar8 = dVar8 * dVar8 + dVar9 * dVar9 + dVar10 * dVar10;
      if (dVar8 < 0.0) {
        local_28 = *(double *)(p_Var3 + 1);
        dVar8 = sqrt(dVar8);
        dVar9 = local_28;
      }
      else {
        dVar8 = SQRT(dVar8);
        dVar9 = *(double *)(p_Var3 + 1);
      }
      if (dVar9 + dVar8 <= local_30) {
        local_30 = dVar9 + dVar8;
      }
    }
    local_38._M_node = local_38._M_node[1]._M_prev[2]._M_next;
  } while ((this->_halfedge)._M_node != local_38._M_node);
  p_Var2 = (seen->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = p_Var6;
  for (p_Var5 = p_Var2; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(_List_node_base **)(p_Var5 + 1) < local_38._M_node]) {
    if (*(_List_node_base **)(p_Var5 + 1) >= local_38._M_node) {
      p_Var4 = p_Var5;
    }
  }
  p_Var3 = (_Rb_tree_header *)p_Var6;
  if ((p_Var4 != p_Var6) &&
     (p_Var3 = (_Rb_tree_header *)p_Var4,
     local_38._M_node < (_List_node_base *)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
    p_Var3 = (_Rb_tree_header *)p_Var6;
  }
  p_Var5 = p_Var6;
  if (p_Var3 != (_Rb_tree_header *)p_Var6) {
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(_List_node_base **)(p_Var2 + 1) < local_38._M_node]) {
      if (*(_List_node_base **)(p_Var2 + 1) >= local_38._M_node) {
        p_Var5 = p_Var2;
      }
    }
    if ((p_Var5 != p_Var6) && (*(_List_node_base **)(p_Var5 + 1) <= local_38._M_node)) {
      p_Var6 = p_Var5;
    }
    if ((double)p_Var6[1]._M_parent <= local_30) goto LAB_00180189;
  }
  std::
  _Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
  ::_M_emplace_unique<std::_List_iterator<CMU462::Halfedge>&,double&>
            ((_Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
              *)seen,&local_38,&local_30);
LAB_00180189:
  local_38._M_node = (this->_halfedge)._M_node;
  do {
    getNeighborhood((Vertex *)(local_38._M_node[1]._M_prev[2]._M_prev + 1),seen,depth + -1);
    local_38._M_node = local_38._M_node[1]._M_prev[2]._M_next;
  } while ((this->_halfedge)._M_node != local_38._M_node);
  return;
}

Assistant:

void Vertex::getNeighborhood(map<HalfedgeIter, double>& seen, int depth) {
  if (depth < 0) return;

  HalfedgeIter h = _halfedge;
  double dist = INF_D;
  do {
    VertexIter u = h->twin()->vertex();
    auto d = seen.find(u->halfedge());
    if (d != seen.end()) {
      dist = std::min(d->second + (u->position - position).norm(), dist);
    }
    h = h->twin()->next();
  } while (h != _halfedge);

  if (seen.find(h) == seen.end() || seen.find(h)->second > dist) {
    seen.emplace(h, dist);
  }

  h = _halfedge;
  do {
    VertexIter u = h->twin()->vertex();
    u->getNeighborhood(seen, depth - 1);
    h = h->twin()->next();
  } while (h != _halfedge);
}